

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::HeapType::getTypeChildren
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,HeapType *this)

{
  pointer pFVar1;
  iterator iVar2;
  undefined4 uVar3;
  size_t sVar4;
  Type *pTVar5;
  Struct *pSVar6;
  size_t sVar7;
  Field *field;
  long lVar8;
  pointer __args;
  initializer_list<wasm::Type> __l;
  Signature local_60;
  Type local_50;
  Type t;
  Type tuple;
  Iterator __begin4;
  
  uVar3 = 0;
  if (0x7c < this->id) {
    uVar3 = *(undefined4 *)(this->id + 0x30);
  }
  switch(uVar3) {
  case 0:
  case 4:
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    break;
  case 1:
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60 = getSignature(this);
    lVar8 = 0;
    do {
      t.id = *(uintptr_t *)((long)&local_60.params.id + lVar8);
      tuple.id = (uintptr_t)&t;
      sVar4 = wasm::Type::size((Type *)tuple.id);
      sVar7 = 0;
      if (sVar4 != 0) {
        do {
          sVar7 = sVar7 + 1;
          pTVar5 = wasm::Type::Iterator::operator*((Iterator *)&tuple);
          local_50.id = pTVar5->id;
          iVar2._M_current =
               (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                      ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,iVar2
                       ,&local_50);
          }
          else {
            (iVar2._M_current)->id = local_50.id;
            (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
            _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        } while (sVar7 != sVar4);
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x10);
    break;
  case 2:
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar6 = getStruct(this);
    pFVar1 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__args = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start; __args != pFVar1; __args = __args + 1) {
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,iVar2,
                   &__args->type);
      }
      else {
        (iVar2._M_current)->id = (__args->type).id;
        (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
    break;
  case 3:
    getArray((HeapType *)&local_60);
    tuple.id = local_60.params.id;
    __l._M_len = 1;
    __l._M_array = &tuple;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,(allocator_type *)&t);
    break;
  default:
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x497);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> HeapType::getTypeChildren() const {
  switch (getKind()) {
    case HeapTypeKind::Basic:
      return {};
    case HeapTypeKind::Func: {
      std::vector<Type> children;
      auto sig = getSignature();
      for (auto tuple : {sig.params, sig.results}) {
        for (auto t : tuple) {
          children.push_back(t);
        }
      }
      return children;
    }
    case HeapTypeKind::Struct: {
      std::vector<Type> children;
      for (auto& field : getStruct().fields) {
        children.push_back(field.type);
      }
      return children;
    }
    case HeapTypeKind::Array:
      return {getArray().element.type};
    case HeapTypeKind::Cont:
      return {};
  }
  WASM_UNREACHABLE("unexpected kind");
}